

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

void __thiscall
Js::HeapArgumentsObject::HeapArgumentsObject
          (HeapArgumentsObject *this,Recycler *recycler,ActivationObject *obj,uint32 formalCount,
          DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableObject *local_28;
  
  ArgumentsObject::ArgumentsObject(&this->super_ArgumentsObject,type);
  (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01501548;
  *(undefined4 *)&this->field_0x20 = 0;
  this->formalCount = formalCount;
  Memory::Recycler::WBSetBit((char *)&this->frameObject);
  (this->frameObject).ptr = obj;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->frameObject);
  (this->deletedArgs).ptr = (BVSparse<Memory::Recycler> *)0x0;
  local_28 = (RecyclableObject *)(this->frameObject).ptr;
  if (local_28 != (RecyclableObject *)0x0) {
    Memory::Recycler::WBSetBit((char *)&local_28);
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
    bVar2 = VarIsImpl<Js::ActivationObject>(local_28);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                  ,0x26,"(!frameObject || VarIsCorrectType(frameObject))",
                                  "!frameObject || VarIsCorrectType(frameObject)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

HeapArgumentsObject::HeapArgumentsObject(Recycler *recycler, ActivationObject* obj, uint32 formalCount, DynamicType * type)
        : ArgumentsObject(type), frameObject(obj), formalCount(formalCount), numOfArguments(0), callerDeleted(false), deletedArgs(nullptr)
    {
        Assert(!frameObject || VarIsCorrectType(frameObject));
    }